

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  U32 *pUVar3;
  char cVar4;
  undefined8 uVar5;
  ZSTD_matchState_t *pZVar6;
  U32 lowestValid;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  ulong *puVar10;
  ulong *puVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  BYTE *litEnd;
  int iVar16;
  seqDef *psVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  BYTE *pBVar26;
  uint uVar27;
  ulong *puVar28;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_d0;
  uint local_c8;
  uint local_c4;
  ZSTD_matchState_t *local_c0;
  uint local_b8;
  uint local_b4;
  ulong *local_b0;
  uint local_a4;
  seqStore_t *local_a0;
  ulong *local_98;
  BYTE *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  long local_58;
  ulong *local_50;
  uint *local_48;
  BYTE *local_40;
  ulong local_38;
  
  local_90 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  local_40 = local_90 + uVar7;
  local_b4 = (ms->cParams).minMatch;
  if (5 < local_b4) {
    local_b4 = 6;
  }
  if (local_b4 < 5) {
    local_b4 = 4;
  }
  local_a4 = (ms->cParams).searchLog;
  local_c4 = 6;
  if (local_a4 < 6) {
    local_c4 = local_a4;
  }
  if (local_c4 < 5) {
    local_c4 = 4;
  }
  puVar22 = (ulong *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar16 = (int)puVar22 - (int)local_90;
  local_60 = *rep;
  local_5c = iVar16 - uVar21;
  if (iVar16 - uVar7 <= uVar21) {
    local_5c = uVar7;
  }
  uVar21 = 0;
  if (ms->loadedDictEnd != 0) {
    local_5c = uVar7;
  }
  local_64 = rep[1];
  local_5c = iVar16 - local_5c;
  uVar7 = local_64;
  if (local_5c < local_64) {
    uVar7 = uVar21;
  }
  uVar9 = local_60;
  if (local_5c < local_60) {
    uVar9 = uVar21;
  }
  uVar25 = (ulong)uVar9;
  ms->lazySkipping = 0;
  local_88 = (ulong *)((long)src + (srcSize - 0x10));
  uVar15 = ms->nextToUpdate;
  uVar18 = (ulong)uVar15;
  uVar12 = ((int)local_88 - (int)(local_90 + uVar18)) + 1;
  uVar27 = 8;
  if (uVar12 < 8) {
    uVar27 = uVar12;
  }
  if (local_88 < local_90 + uVar18) {
    uVar27 = uVar21;
  }
  bVar8 = (byte)local_c4;
  local_c8 = uVar7;
  local_c0 = ms;
  local_a0 = seqStore;
  local_48 = rep;
  if (uVar15 < uVar27 + uVar15) {
    local_b0 = (ulong *)srcSize;
    local_98 = puVar22;
    if (0x20 < ms->rowHashLog + 8) {
LAB_001606e7:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar26 = ms->tagTable;
    uVar20 = ms->hashSalt;
    cVar4 = (char)ms->rowHashLog;
    do {
      if (local_b4 == 5) {
        uVar24 = *(long *)(local_90 + uVar18) * -0x30e4432345000000;
LAB_0015faa0:
        uVar21 = (uint)((uVar24 ^ uVar20) >> (0x38U - cVar4 & 0x3f));
      }
      else {
        if (local_b4 == 6) {
          uVar24 = *(long *)(local_90 + uVar18) * -0x30e4432340650000;
          goto LAB_0015faa0;
        }
        uVar21 = (*(int *)(local_90 + uVar18) * -0x61c8864f ^ (uint)uVar20) >>
                 (0x18U - cVar4 & 0x1f);
      }
      uVar12 = (uVar21 >> 8) << (bVar8 & 0x1f);
      if (((ulong)(pUVar3 + uVar12) & 0x3f) != 0) {
LAB_0016060e:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a2,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar26 + uVar12) & ~(-1L << (bVar8 & 0x3f))) != 0) {
LAB_001605ef:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76a3,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar18 & 7] = uVar21;
      uVar18 = uVar18 + 1;
    } while (uVar27 + uVar15 != uVar18);
  }
  puVar23 = (ulong *)(srcSize + (long)src);
  if (puVar22 < local_88) {
    local_80 = (ulong *)((long)puVar23 + -7);
    local_70 = (ulong *)((long)puVar23 + -3);
    local_78 = (ulong *)((long)puVar23 + -1);
    local_50 = puVar23 + -4;
    local_38 = ~(-1L << (bVar8 & 0x3f));
    local_b0 = puVar23;
    uVar21 = local_b4;
    do {
      pZVar6 = local_c0;
      local_98 = (ulong *)((long)puVar22 + 1);
      uVar9 = (uint)uVar25;
      local_58 = -uVar25;
      if (uVar9 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        if (*(int *)((long)local_98 - uVar25) == *(int *)((long)puVar22 + 1)) {
          puVar28 = (ulong *)((long)puVar22 + 5);
          puVar10 = (ulong *)((long)puVar22 + local_58 + 5);
          puVar11 = puVar28;
          if (puVar28 < local_80) {
            if (*puVar10 == *puVar28) {
              lVar13 = 0;
              do {
                puVar11 = (ulong *)((long)puVar22 + lVar13 + 0xd);
                if (local_80 <= puVar11) {
                  puVar10 = (ulong *)((long)puVar22 + local_58 + lVar13 + 0xd);
                  puVar11 = (ulong *)((long)puVar22 + lVar13 + 0xd);
                  goto LAB_0015fc60;
                }
                uVar18 = *(ulong *)((long)puVar22 + lVar13 + local_58 + 0xd);
                uVar20 = *puVar11;
                lVar13 = lVar13 + 8;
              } while (uVar18 == uVar20);
              uVar20 = uVar20 ^ uVar18;
              uVar18 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar13;
            }
            else {
              uVar20 = *puVar28 ^ *puVar10;
              uVar18 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar18 = uVar18 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0015fc60:
            if ((puVar11 < local_70) && ((int)*puVar10 == (int)*puVar11)) {
              puVar11 = (ulong *)((long)puVar11 + 4);
              puVar10 = (ulong *)((long)puVar10 + 4);
            }
            if ((puVar11 < local_78) && ((short)*puVar10 == (short)*puVar11)) {
              puVar11 = (ulong *)((long)puVar11 + 2);
              puVar10 = (ulong *)((long)puVar10 + 2);
            }
            if (puVar11 < puVar23) {
              puVar11 = (ulong *)((long)puVar11 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar11));
            }
            uVar18 = (long)puVar11 - (long)puVar28;
          }
          uVar18 = uVar18 + 4;
        }
      }
      local_d0 = 999999999;
      local_c8 = uVar7;
      if (uVar21 == 6) {
        if (local_c4 == 6) {
          uVar20 = ZSTD_RowFindBestMatch_noDict_6_6
                             (local_c0,(BYTE *)puVar22,(BYTE *)puVar23,&local_d0);
        }
        else if (local_c4 == 5) {
          uVar20 = ZSTD_RowFindBestMatch_noDict_6_5
                             (local_c0,(BYTE *)puVar22,(BYTE *)puVar23,&local_d0);
        }
        else {
          uVar20 = ZSTD_RowFindBestMatch_noDict_6_4
                             (local_c0,(BYTE *)puVar22,(BYTE *)puVar23,&local_d0);
        }
      }
      else if (uVar21 == 5) {
        if (local_c4 == 6) {
          uVar20 = ZSTD_RowFindBestMatch_noDict_5_6
                             (local_c0,(BYTE *)puVar22,(BYTE *)puVar23,&local_d0);
        }
        else if (local_c4 == 5) {
          uVar20 = ZSTD_RowFindBestMatch_noDict_5_5
                             (local_c0,(BYTE *)puVar22,(BYTE *)puVar23,&local_d0);
        }
        else {
          uVar20 = ZSTD_RowFindBestMatch_noDict_5_4
                             (local_c0,(BYTE *)puVar22,(BYTE *)puVar23,&local_d0);
        }
      }
      else if (local_c4 == 6) {
        uVar20 = ZSTD_RowFindBestMatch_noDict_4_6
                           (local_c0,(BYTE *)puVar22,(BYTE *)puVar23,&local_d0);
      }
      else if (local_c4 == 5) {
        uVar20 = ZSTD_RowFindBestMatch_noDict_4_5
                           (local_c0,(BYTE *)puVar22,(BYTE *)puVar23,&local_d0);
      }
      else {
        uVar20 = ZSTD_RowFindBestMatch_noDict_4_4
                           (local_c0,(BYTE *)puVar22,(BYTE *)puVar23,&local_d0);
      }
      uVar24 = uVar18;
      if (uVar18 < uVar20) {
        uVar24 = uVar20;
      }
      if (uVar24 < 4) {
        pZVar6->lazySkipping = (uint)(0x7ff < (ulong)((long)puVar22 - (long)src));
        puVar23 = local_b0;
        puVar22 = (ulong *)((long)puVar22 + ((ulong)((long)puVar22 - (long)src) >> 8) + 1);
        uVar7 = local_c8;
      }
      else {
        puVar23 = puVar22;
        uVar25 = local_d0;
        if (uVar20 <= uVar18) {
          puVar23 = local_98;
          uVar25 = 1;
        }
        uVar18 = uVar24;
        local_b8 = uVar9;
        if (puVar22 < local_88) {
          puVar28 = (ulong *)((long)puVar22 + 0xd);
          local_d0 = uVar25;
          local_98 = puVar23;
          do {
            puVar11 = (ulong *)((long)puVar22 + 1);
            uVar18 = uVar24;
            if (local_d0 == 0) {
              uVar25 = 0;
            }
            else {
              uVar25 = local_d0;
              if ((local_b8 != 0) && (*(int *)puVar11 == *(int *)((long)puVar11 + local_58))) {
                puVar23 = (ulong *)((long)puVar22 + local_58 + 5);
                puVar22 = (ulong *)((long)puVar22 + 5);
                puVar10 = puVar22;
                if (puVar22 < local_80) {
                  puVar10 = puVar28;
                  if (*puVar23 == *puVar22) {
                    do {
                      if (local_80 <= puVar10) {
                        puVar23 = (ulong *)((long)puVar10 + local_58);
                        goto LAB_0015fe59;
                      }
                      puVar23 = (ulong *)((long)puVar10 + local_58);
                      uVar20 = *puVar10;
                      puVar10 = puVar10 + 1;
                    } while (*puVar23 == uVar20);
                    uVar20 = uVar20 ^ *puVar23;
                    uVar14 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    puVar10 = (ulong *)((long)puVar10 + ((uVar14 >> 3 & 0x1fffffff) - 8));
                    goto LAB_0015fe96;
                  }
                  uVar14 = *puVar22 ^ *puVar23;
                  uVar20 = 0;
                  if (uVar14 != 0) {
                    for (; (uVar14 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar20 = uVar20 >> 3 & 0x1fffffff;
                }
                else {
LAB_0015fe59:
                  if ((puVar10 < local_70) && ((int)*puVar23 == (int)*puVar10)) {
                    puVar10 = (ulong *)((long)puVar10 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar10 < local_78) && ((short)*puVar23 == (short)*puVar10)) {
                    puVar10 = (ulong *)((long)puVar10 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar10 < local_b0) {
                    puVar10 = (ulong *)((long)puVar10 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar10));
                  }
LAB_0015fe96:
                  uVar20 = (long)puVar10 - (long)puVar22;
                  if (0xfffffffffffffffb < uVar20) goto LAB_0015fec6;
                }
                uVar7 = 0x1f;
                if ((uint)local_d0 != 0) {
                  for (; (uint)local_d0 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                  }
                }
                if ((int)((uVar7 ^ 0x1f) + (int)uVar24 * 3 + -0x1e) < (int)(uVar20 + 4) * 3) {
                  uVar25 = 1;
                  uVar18 = uVar20 + 4;
                  local_98 = puVar11;
                }
              }
            }
LAB_0015fec6:
            local_d0 = 999999999;
            if (local_b4 == 6) {
              if (local_c4 == 6) {
                uVar24 = ZSTD_RowFindBestMatch_noDict_6_6
                                   (local_c0,(BYTE *)puVar11,(BYTE *)local_b0,&local_d0);
              }
              else if (local_c4 == 5) {
                uVar24 = ZSTD_RowFindBestMatch_noDict_6_5
                                   (local_c0,(BYTE *)puVar11,(BYTE *)local_b0,&local_d0);
              }
              else {
                uVar24 = ZSTD_RowFindBestMatch_noDict_6_4
                                   (local_c0,(BYTE *)puVar11,(BYTE *)local_b0,&local_d0);
              }
            }
            else if (local_b4 == 5) {
              if (local_c4 == 6) {
                uVar24 = ZSTD_RowFindBestMatch_noDict_5_6
                                   (local_c0,(BYTE *)puVar11,(BYTE *)local_b0,&local_d0);
              }
              else if (local_c4 == 5) {
                uVar24 = ZSTD_RowFindBestMatch_noDict_5_5
                                   (local_c0,(BYTE *)puVar11,(BYTE *)local_b0,&local_d0);
              }
              else {
                uVar24 = ZSTD_RowFindBestMatch_noDict_5_4
                                   (local_c0,(BYTE *)puVar11,(BYTE *)local_b0,&local_d0);
              }
            }
            else if (local_c4 == 6) {
              uVar24 = ZSTD_RowFindBestMatch_noDict_4_6
                                 (local_c0,(BYTE *)puVar11,(BYTE *)local_b0,&local_d0);
            }
            else if (local_c4 == 5) {
              uVar24 = ZSTD_RowFindBestMatch_noDict_4_5
                                 (local_c0,(BYTE *)puVar11,(BYTE *)local_b0,&local_d0);
            }
            else {
              uVar24 = ZSTD_RowFindBestMatch_noDict_4_4
                                 (local_c0,(BYTE *)puVar11,(BYTE *)local_b0,&local_d0);
            }
            puVar23 = local_98;
            if (uVar24 < 4) break;
            uVar7 = 0x1f;
            if ((uint)uVar25 != 0) {
              for (; (uint)uVar25 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            iVar16 = 0x1f;
            if ((uint)local_d0 != 0) {
              for (; (uint)local_d0 >> iVar16 == 0; iVar16 = iVar16 + -1) {
              }
            }
            if (((int)uVar24 * 4 - iVar16 <= (int)((uVar7 ^ 0x1f) + (int)uVar18 * 4 + -0x1b)) ||
               (puVar28 = (ulong *)((long)puVar28 + 1), puVar22 = puVar11, uVar25 = local_d0,
               puVar23 = puVar11, uVar18 = uVar24, local_98 = puVar11, local_88 <= puVar11)) break;
          } while( true );
        }
        pZVar6 = local_c0;
        if (3 < uVar25) {
          if ((src < puVar23) && (local_40 < (BYTE *)((long)puVar23 + (3 - uVar25)))) {
            puVar22 = puVar23;
            while (puVar23 = puVar22,
                  *(BYTE *)((long)puVar22 + -1) == *(BYTE *)((long)puVar22 + (2 - uVar25))) {
              puVar23 = (ulong *)((long)puVar22 + -1);
              uVar18 = uVar18 + 1;
              if ((puVar23 <= src) ||
                 (pBVar26 = (BYTE *)((long)puVar22 + (2 - uVar25)), puVar22 = puVar23,
                 pBVar26 <= local_40)) break;
            }
          }
          local_c8 = local_b8;
          local_b8 = (U32)uVar25 - 3;
        }
        if (local_a0->maxNbSeq <=
            (ulong)((long)local_a0->sequences - (long)local_a0->sequencesStart >> 3)) {
LAB_001606a9:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_a0->maxNbLit) {
LAB_0016066b:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar20 = (long)puVar23 - (long)src;
        puVar22 = (ulong *)local_a0->lit;
        if (local_a0->litStart + local_a0->maxNbLit < (BYTE *)((long)puVar22 + uVar20)) {
LAB_0016064c:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_b0 < puVar23) {
LAB_0016062d:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < puVar23) {
          ZSTD_safecopyLiterals((BYTE *)puVar22,(BYTE *)src,(BYTE *)puVar23,(BYTE *)local_50);
LAB_00160135:
          local_a0->lit = local_a0->lit + uVar20;
          if (0xffff < uVar20) {
            if (local_a0->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_a0->longLengthType = ZSTD_llt_literalLength;
            local_a0->longLengthPos =
                 (U32)((ulong)((long)local_a0->sequences - (long)local_a0->sequencesStart) >> 3);
          }
        }
        else {
          uVar24 = *(ulong *)((long)src + 8);
          *puVar22 = *src;
          puVar22[1] = uVar24;
          pBVar26 = local_a0->lit;
          if (0x10 < uVar20) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar26 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar24 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar26 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar26 + 0x18) = uVar24;
            if (0x20 < (long)uVar20) {
              lVar13 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar13 + 0x20);
                uVar5 = puVar2[1];
                pBVar1 = pBVar26 + lVar13 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar5;
                puVar2 = (undefined8 *)((long)src + lVar13 + 0x30);
                uVar5 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar5;
                lVar13 = lVar13 + 0x20;
              } while (pBVar1 + 0x20 < pBVar26 + uVar20);
            }
            goto LAB_00160135;
          }
          local_a0->lit = pBVar26 + uVar20;
        }
        uVar21 = local_b4;
        psVar17 = local_a0->sequences;
        psVar17->litLength = (U16)uVar20;
        psVar17->offBase = (U32)uVar25;
        if (uVar18 < 3) {
LAB_0016068a:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar18 - 3) {
          if (local_a0->longLengthType != ZSTD_llt_none) {
LAB_001606c8:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_a0->longLengthType = ZSTD_llt_matchLength;
          local_a0->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)local_a0->sequencesStart) >> 3);
        }
        psVar17->mlBase = (U16)(uVar18 - 3);
        psVar17 = psVar17 + 1;
        local_a0->sequences = psVar17;
        if (pZVar6->lazySkipping != 0) {
          uVar7 = pZVar6->nextToUpdate;
          uVar25 = (ulong)uVar7;
          uVar9 = ((int)local_88 - (int)(local_90 + uVar25)) + 1;
          if (7 < uVar9) {
            uVar9 = 8;
          }
          if (local_88 < local_90 + uVar25) {
            uVar9 = 0;
          }
          if (uVar7 < uVar9 + uVar7) {
            if (0x20 < pZVar6->rowHashLog + 8) goto LAB_001606e7;
            pUVar3 = pZVar6->hashTable;
            pBVar26 = pZVar6->tagTable;
            uVar20 = pZVar6->hashSalt;
            cVar4 = (char)pZVar6->rowHashLog;
            do {
              if (local_b4 == 5) {
                uVar24 = *(long *)(local_90 + uVar25) * -0x30e4432345000000;
LAB_001602ef:
                uVar15 = (uint)((uVar24 ^ uVar20) >> (0x38U - cVar4 & 0x3f));
              }
              else {
                if (local_b4 == 6) {
                  uVar24 = *(long *)(local_90 + uVar25) * -0x30e4432340650000;
                  goto LAB_001602ef;
                }
                uVar15 = (*(int *)(local_90 + uVar25) * -0x61c8864f ^ (uint)uVar20) >>
                         (0x18U - cVar4 & 0x1f);
              }
              uVar27 = (uVar15 >> 8) << ((byte)local_c4 & 0x1f);
              if (((ulong)(pUVar3 + uVar27) & 0x3f) != 0) goto LAB_0016060e;
              if ((local_38 & (ulong)(pBVar26 + uVar27)) != 0) goto LAB_001605ef;
              pZVar6->hashCache[(uint)uVar25 & 7] = uVar15;
              uVar25 = uVar25 + 1;
            } while (uVar9 + uVar7 != uVar25);
          }
          pZVar6->lazySkipping = 0;
        }
        src = (void *)((long)puVar23 + uVar18);
        puVar23 = local_b0;
        if ((local_c8 == 0) || (local_88 < src)) {
          uVar25 = (ulong)local_b8;
          puVar22 = (ulong *)src;
          uVar7 = local_c8;
        }
        else {
          uVar25 = (ulong)local_b8;
          uVar18 = (ulong)local_c8;
          while( true ) {
            uVar20 = uVar25;
            uVar9 = (uint)uVar20;
            uVar25 = uVar20;
            puVar22 = (ulong *)src;
            uVar7 = (uint)uVar18;
            if ((int)*src != *(int *)((long)src - uVar18)) break;
            lVar13 = -uVar18;
            puVar22 = (ulong *)((long)src + 4);
            puVar11 = (ulong *)((long)src + lVar13 + 4);
            puVar28 = puVar22;
            if (puVar22 < local_80) {
              if (*puVar11 == *puVar22) {
                lVar19 = 0;
                do {
                  puVar28 = (ulong *)((long)src + lVar19 + 0xc);
                  if (local_80 <= puVar28) {
                    puVar11 = (ulong *)((long)src + lVar13 + lVar19 + 0xc);
                    puVar28 = (ulong *)((long)src + lVar19 + 0xc);
                    goto LAB_00160444;
                  }
                  uVar25 = *(ulong *)((long)src + lVar19 + lVar13 + 0xc);
                  uVar24 = *puVar28;
                  lVar19 = lVar19 + 8;
                } while (uVar25 == uVar24);
                uVar24 = uVar24 ^ uVar25;
                uVar25 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar19;
              }
              else {
                uVar24 = *puVar22 ^ *puVar11;
                uVar25 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar25 = uVar25 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00160444:
              if ((puVar28 < local_70) && ((int)*puVar11 == (int)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 4);
                puVar11 = (ulong *)((long)puVar11 + 4);
              }
              if ((puVar28 < local_78) && ((short)*puVar11 == (short)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 2);
                puVar11 = (ulong *)((long)puVar11 + 2);
              }
              if (puVar28 < puVar23) {
                puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar11 == (BYTE)*puVar28));
              }
              uVar25 = (long)puVar28 - (long)puVar22;
            }
            if (local_a0->maxNbSeq <= (ulong)((long)psVar17 - (long)local_a0->sequencesStart >> 3))
            goto LAB_001606a9;
            if (0x20000 < local_a0->maxNbLit) goto LAB_0016066b;
            puVar22 = (ulong *)local_a0->lit;
            if (local_a0->litStart + local_a0->maxNbLit < puVar22) goto LAB_0016064c;
            if (puVar23 < src) goto LAB_0016062d;
            if (local_50 < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar22,(BYTE *)src,(BYTE *)src,(BYTE *)local_50);
              puVar23 = local_b0;
            }
            else {
              uVar24 = *(ulong *)((long)src + 8);
              *puVar22 = *src;
              puVar22[1] = uVar24;
            }
            psVar17 = local_a0->sequences;
            psVar17->litLength = 0;
            psVar17->offBase = 1;
            if (uVar25 + 4 < 3) goto LAB_0016068a;
            if (0xffff < uVar25 + 1) {
              if (local_a0->longLengthType != ZSTD_llt_none) goto LAB_001606c8;
              local_a0->longLengthType = ZSTD_llt_matchLength;
              local_a0->longLengthPos =
                   (U32)((ulong)((long)psVar17 - (long)local_a0->sequencesStart) >> 3);
            }
            psVar17->mlBase = (U16)(uVar25 + 1);
            psVar17 = psVar17 + 1;
            local_a0->sequences = psVar17;
            src = (void *)((long)src + uVar25 + 4);
            uVar25 = uVar18;
            puVar22 = (ulong *)src;
            uVar7 = uVar9;
            if ((uVar9 == 0) || (uVar18 = uVar20, local_88 < src)) break;
          }
        }
      }
      uVar9 = (uint)uVar25;
      local_c8 = uVar7;
    } while (puVar22 < local_88);
  }
  if (local_64 <= local_5c) {
    local_64 = 0;
  }
  uVar7 = local_64;
  if (uVar9 != 0) {
    uVar7 = local_60;
  }
  if (local_60 <= local_5c) {
    uVar7 = local_64;
    local_60 = 0;
  }
  if (uVar9 != 0) {
    local_60 = uVar9;
  }
  if (local_c8 != 0) {
    uVar7 = local_c8;
  }
  *local_48 = local_60;
  local_48[1] = uVar7;
  return (long)puVar23 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_noDict);
}